

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int pager_playback(Pager *pPager,int isHot)

{
  i64 *pOffset;
  sqlite3_vfs *psVar1;
  char *pcVar2;
  ulong uVar3;
  char *pcVar4;
  u32 uVar5;
  Pgno PVar6;
  sqlite3_file *psVar7;
  i64 iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  sqlite3_file *psVar13;
  undefined4 *puVar14;
  ulong uVar15;
  char *z;
  undefined4 *p;
  int iVar16;
  ulong local_90;
  u32 nRec;
  Pgno mxPg;
  sqlite3_file *local_80;
  int res;
  undefined4 *local_70;
  i64 nSuperJournal;
  sqlite3_vfs *local_60;
  i64 szJ;
  char *local_50;
  sqlite3_file *local_48;
  u32 savedPageSize;
  int local_3c;
  long local_38;
  
  psVar1 = pPager->pVfs;
  mxPg = 0;
  res = 1;
  savedPageSize = (u32)pPager->pageSize;
  iVar9 = (*pPager->jfd->pMethods->xFileSize)(pPager->jfd,&szJ);
  if (iVar9 == 0) {
    pcVar2 = pPager->pTmpSpace;
    iVar9 = readSuperJournal(pPager->jfd,pcVar2,pPager->pVfs->mxPathname + 1);
    if (iVar9 == 0) {
      if (*pcVar2 == '\0') {
        iVar9 = 0;
      }
      else {
        iVar9 = (*psVar1->xAccess)(psVar1,pcVar2,0,&res);
      }
    }
    local_90 = 0;
    if ((iVar9 == 0) && (res != 0)) {
      pOffset = &pPager->journalOff;
      pPager->journalOff = 0;
      local_90 = 0;
      iVar10 = isHot;
LAB_0015e958:
      iVar9 = readJournalHdr(pPager,isHot,szJ,&nRec,&mxPg);
      PVar6 = mxPg;
      if (iVar9 == 0) {
        uVar15 = (ulong)pPager->sectorSize;
        if (nRec == 0xffffffff) {
          nRec = (u32)((long)(szJ - uVar15) / (pPager->pageSize + 8));
        }
        uVar3 = *pOffset;
        if ((nRec == 0 && isHot == 0) && (pPager->journalHdr + uVar15 == uVar3)) {
          nRec = (u32)((long)(szJ - uVar3) / (pPager->pageSize + 8));
        }
        uVar5 = nRec;
        if (uVar3 == uVar15) {
          iVar9 = pager_truncate(pPager,mxPg);
          if (iVar9 != 0) goto LAB_0015eaa9;
          pPager->dbSize = PVar6;
          if (pPager->mxPgno < PVar6) {
            pPager->mxPgno = PVar6;
          }
        }
        iVar11 = (int)local_90;
        local_80 = (sqlite3_file *)CONCAT44(local_80._4_4_,iVar11 + uVar5);
        for (iVar16 = 0; -uVar5 != iVar16; iVar16 = iVar16 + -1) {
          if (iVar10 != 0) {
            pager_reset(pPager);
          }
          iVar9 = pager_playback_one_page(pPager,pOffset,(Bitvec *)0x0,1,0);
          if (iVar9 != 0) {
            if (iVar9 == 0x65) {
              *pOffset = szJ;
              local_90 = (ulong)(uint)(iVar11 - iVar16);
              iVar10 = 0;
              goto LAB_0015e958;
            }
            if (iVar9 != 0x20a) {
              local_90 = (ulong)(uint)(iVar11 - iVar16);
              goto LAB_0015eaa4;
            }
            local_90 = (ulong)(uint)(iVar11 - iVar16);
            goto LAB_0015eb00;
          }
          iVar10 = 0;
        }
        local_90 = (ulong)local_80 & 0xffffffff;
        goto LAB_0015e958;
      }
      if (iVar9 == 0x65) goto LAB_0015eb00;
    }
    else {
LAB_0015eaa4:
      if (iVar9 == 0) {
LAB_0015eb00:
        iVar9 = sqlite3PagerSetPagesize(pPager,&savedPageSize,-1);
        pPager->changeCountDone = pPager->tempFile;
        if (iVar9 != 0) goto LAB_0015eaaf;
        pcVar4 = pPager->pTmpSpace;
        pcVar2 = pcVar4 + 4;
        iVar9 = readSuperJournal(pPager->jfd,pcVar2,pPager->pVfs->mxPathname + 1);
        if ((iVar9 != 0) ||
           (((byte)(pPager->eState - 4) < 0xfd &&
            (iVar9 = sqlite3PagerSync(pPager,(char *)0x0), iVar9 != 0)))) goto LAB_0015eaaf;
        iVar9 = pager_end_transaction(pPager,(uint)(*pcVar2 != '\0'),0);
        if ((iVar9 != 0) || ((iVar9 = 0, *pcVar2 == '\0' || (res == 0)))) goto LAB_0015eaaf;
        pcVar4[0] = '\0';
        pcVar4[1] = '\0';
        pcVar4[2] = '\0';
        pcVar4[3] = '\0';
        psVar1 = pPager->pVfs;
        psVar13 = (sqlite3_file *)sqlite3MallocZero((long)psVar1->szOsFile * 2);
        iVar9 = 7;
        local_80 = psVar13;
        if ((psVar13 == (sqlite3_file *)0x0) ||
           (iVar9 = (*psVar1->xOpen)(psVar1,pcVar2,psVar13,0x4001,(int *)0x0), iVar9 != 0)) {
LAB_0015ebd9:
          p = (undefined4 *)0x0;
        }
        else {
          local_48 = (sqlite3_file *)(long)psVar1->szOsFile;
          iVar9 = (*psVar13->pMethods->xFileSize)(psVar13,&nSuperJournal);
          if (iVar9 == 0) {
            local_38 = (long)psVar1->mxPathname;
            local_60 = psVar1;
            puVar14 = (undefined4 *)sqlite3Malloc(nSuperJournal + local_38 + 7);
            iVar8 = nSuperJournal;
            iVar9 = 7;
            if (puVar14 == (undefined4 *)0x0) goto LAB_0015ebd9;
            *puVar14 = 0;
            pcVar4 = (char *)(puVar14 + 1);
            local_70 = puVar14;
            iVar9 = (*local_80->pMethods->xRead)(local_80,pcVar4,(int)nSuperJournal,0);
            p = local_70;
            if (iVar9 == 0) {
              psVar13 = (sqlite3_file *)((long)&local_80->pMethods + (long)&local_48->pMethods);
              local_38 = local_38 + 1;
              local_50 = (char *)((long)local_70 + iVar8 + 6);
              pcVar4[nSuperJournal] = '\0';
              *(undefined1 *)((long)puVar14 + nSuperJournal + 5) = 0;
              local_48 = psVar13;
              for (z = pcVar4; psVar7 = local_80, (long)z - (long)pcVar4 < nSuperJournal;
                  z = z + (ulong)uVar12 + 1) {
                iVar10 = (*local_60->xAccess)(local_60,z,0,&local_3c);
                p = local_70;
                iVar9 = iVar10;
                if (iVar10 != 0) goto LAB_0015ebdb;
                if (local_3c != 0) {
                  iVar9 = (*local_60->xOpen)(local_60,z,psVar13,0x4001,(int *)0x0);
                  p = local_70;
                  if (iVar9 != 0) goto LAB_0015ebdb;
                  iVar9 = readSuperJournal(psVar13,local_50,(u32)local_38);
                  if (psVar13->pMethods != (sqlite3_io_methods *)0x0) {
                    (*psVar13->pMethods->xClose)(psVar13);
                    local_48->pMethods = (sqlite3_io_methods *)0x0;
                    psVar13 = local_48;
                  }
                  p = local_70;
                  if ((iVar9 != 0) ||
                     ((*local_50 != '\0' &&
                      (iVar11 = strcmp(local_50,pcVar2), p = local_70, iVar9 = iVar10, iVar11 == 0))
                     )) goto LAB_0015ebdb;
                }
                uVar12 = sqlite3Strlen30(z);
              }
              if (local_80->pMethods != (sqlite3_io_methods *)0x0) {
                (*local_80->pMethods->xClose)(local_80);
                psVar7->pMethods = (sqlite3_io_methods *)0x0;
              }
              if (local_60->xDelete == (_func_int_sqlite3_vfs_ptr_char_ptr_int *)0x0) {
                iVar9 = 0;
                p = local_70;
              }
              else {
                iVar9 = (*local_60->xDelete)(local_60,pcVar2,0);
                p = local_70;
              }
            }
          }
          else {
            p = (undefined4 *)0x0;
          }
        }
LAB_0015ebdb:
        sqlite3_free(p);
        if (local_80 != (sqlite3_file *)0x0) {
          if (local_80->pMethods != (sqlite3_io_methods *)0x0) {
            (*local_80->pMethods->xClose)(local_80);
            local_80->pMethods = (sqlite3_io_methods *)0x0;
          }
          sqlite3_free(local_80);
        }
        goto LAB_0015eaaf;
      }
    }
  }
  else {
    local_90 = 0;
  }
LAB_0015eaa9:
  pPager->changeCountDone = pPager->tempFile;
LAB_0015eaaf:
  if ((isHot != 0) && ((int)local_90 != 0)) {
    sqlite3_log(0x21b,"recovered %d pages from %s",local_90,pPager->zJournal);
  }
  setSectorSize(pPager);
  return iVar9;
}

Assistant:

static int pager_playback(Pager *pPager, int isHot){
  sqlite3_vfs *pVfs = pPager->pVfs;
  i64 szJ;                 /* Size of the journal file in bytes */
  u32 nRec;                /* Number of Records in the journal */
  u32 u;                   /* Unsigned loop counter */
  Pgno mxPg = 0;           /* Size of the original file in pages */
  int rc;                  /* Result code of a subroutine */
  int res = 1;             /* Value returned by sqlite3OsAccess() */
  char *zSuper = 0;        /* Name of super-journal file if any */
  int needPagerReset;      /* True to reset page prior to first page rollback */
  int nPlayback = 0;       /* Total number of pages restored from journal */
  u32 savedPageSize = pPager->pageSize;

  /* Figure out how many records are in the journal.  Abort early if
  ** the journal is empty.
  */
  assert( isOpen(pPager->jfd) );
  rc = sqlite3OsFileSize(pPager->jfd, &szJ);
  if( rc!=SQLITE_OK ){
    goto end_playback;
  }

  /* Read the super-journal name from the journal, if it is present.
  ** If a super-journal file name is specified, but the file is not
  ** present on disk, then the journal is not hot and does not need to be
  ** played back.
  **
  ** TODO: Technically the following is an error because it assumes that
  ** buffer Pager.pTmpSpace is (mxPathname+1) bytes or larger. i.e. that
  ** (pPager->pageSize >= pPager->pVfs->mxPathname+1). Using os_unix.c,
  ** mxPathname is 512, which is the same as the minimum allowable value
  ** for pageSize.
  */
  zSuper = pPager->pTmpSpace;
  rc = readSuperJournal(pPager->jfd, zSuper, pPager->pVfs->mxPathname+1);
  if( rc==SQLITE_OK && zSuper[0] ){
    rc = sqlite3OsAccess(pVfs, zSuper, SQLITE_ACCESS_EXISTS, &res);
  }
  zSuper = 0;
  if( rc!=SQLITE_OK || !res ){
    goto end_playback;
  }
  pPager->journalOff = 0;
  needPagerReset = isHot;

  /* This loop terminates either when a readJournalHdr() or
  ** pager_playback_one_page() call returns SQLITE_DONE or an IO error
  ** occurs.
  */
  while( 1 ){
    /* Read the next journal header from the journal file.  If there are
    ** not enough bytes left in the journal file for a complete header, or
    ** it is corrupted, then a process must have failed while writing it.
    ** This indicates nothing more needs to be rolled back.
    */
    rc = readJournalHdr(pPager, isHot, szJ, &nRec, &mxPg);
    if( rc!=SQLITE_OK ){
      if( rc==SQLITE_DONE ){
        rc = SQLITE_OK;
      }
      goto end_playback;
    }

    /* If nRec is 0xffffffff, then this journal was created by a process
    ** working in no-sync mode. This means that the rest of the journal
    ** file consists of pages, there are no more journal headers. Compute
    ** the value of nRec based on this assumption.
    */
    if( nRec==0xffffffff ){
      assert( pPager->journalOff==JOURNAL_HDR_SZ(pPager) );
      nRec = (int)((szJ - JOURNAL_HDR_SZ(pPager))/JOURNAL_PG_SZ(pPager));
    }

    /* If nRec is 0 and this rollback is of a transaction created by this
    ** process and if this is the final header in the journal, then it means
    ** that this part of the journal was being filled but has not yet been
    ** synced to disk.  Compute the number of pages based on the remaining
    ** size of the file.
    **
    ** The third term of the test was added to fix ticket #2565.
    ** When rolling back a hot journal, nRec==0 always means that the next
    ** chunk of the journal contains zero pages to be rolled back.  But
    ** when doing a ROLLBACK and the nRec==0 chunk is the last chunk in
    ** the journal, it means that the journal might contain additional
    ** pages that need to be rolled back and that the number of pages
    ** should be computed based on the journal file size.
    */
    if( nRec==0 && !isHot &&
        pPager->journalHdr+JOURNAL_HDR_SZ(pPager)==pPager->journalOff ){
      nRec = (int)((szJ - pPager->journalOff) / JOURNAL_PG_SZ(pPager));
    }

    /* If this is the first header read from the journal, truncate the
    ** database file back to its original size.
    */
    if( pPager->journalOff==JOURNAL_HDR_SZ(pPager) ){
      rc = pager_truncate(pPager, mxPg);
      if( rc!=SQLITE_OK ){
        goto end_playback;
      }
      pPager->dbSize = mxPg;
      if( pPager->mxPgno<mxPg ){
        pPager->mxPgno = mxPg;
      }
    }

    /* Copy original pages out of the journal and back into the
    ** database file and/or page cache.
    */
    for(u=0; u<nRec; u++){
      if( needPagerReset ){
        pager_reset(pPager);
        needPagerReset = 0;
      }
      rc = pager_playback_one_page(pPager,&pPager->journalOff,0,1,0);
      if( rc==SQLITE_OK ){
        nPlayback++;
      }else{
        if( rc==SQLITE_DONE ){
          pPager->journalOff = szJ;
          break;
        }else if( rc==SQLITE_IOERR_SHORT_READ ){
          /* If the journal has been truncated, simply stop reading and
          ** processing the journal. This might happen if the journal was
          ** not completely written and synced prior to a crash.  In that
          ** case, the database should have never been written in the
          ** first place so it is OK to simply abandon the rollback. */
          rc = SQLITE_OK;
          goto end_playback;
        }else{
          /* If we are unable to rollback, quit and return the error
          ** code.  This will cause the pager to enter the error state
          ** so that no further harm will be done.  Perhaps the next
          ** process to come along will be able to rollback the database.
          */
          goto end_playback;
        }
      }
    }
  }
  /*NOTREACHED*/
  assert( 0 );

end_playback:
  if( rc==SQLITE_OK ){
    rc = sqlite3PagerSetPagesize(pPager, &savedPageSize, -1);
  }
  /* Following a rollback, the database file should be back in its original
  ** state prior to the start of the transaction, so invoke the
  ** SQLITE_FCNTL_DB_UNCHANGED file-control method to disable the
  ** assertion that the transaction counter was modified.
  */
#ifdef SQLITE_DEBUG
  sqlite3OsFileControlHint(pPager->fd,SQLITE_FCNTL_DB_UNCHANGED,0);
#endif

  /* If this playback is happening automatically as a result of an IO or
  ** malloc error that occurred after the change-counter was updated but
  ** before the transaction was committed, then the change-counter
  ** modification may just have been reverted. If this happens in exclusive
  ** mode, then subsequent transactions performed by the connection will not
  ** update the change-counter at all. This may lead to cache inconsistency
  ** problems for other processes at some point in the future. So, just
  ** in case this has happened, clear the changeCountDone flag now.
  */
  pPager->changeCountDone = pPager->tempFile;

  if( rc==SQLITE_OK ){
    /* Leave 4 bytes of space before the super-journal filename in memory.
    ** This is because it may end up being passed to sqlite3OsOpen(), in
    ** which case it requires 4 0x00 bytes in memory immediately before
    ** the filename. */
    zSuper = &pPager->pTmpSpace[4];
    rc = readSuperJournal(pPager->jfd, zSuper, pPager->pVfs->mxPathname+1);
    testcase( rc!=SQLITE_OK );
  }
  if( rc==SQLITE_OK
   && (pPager->eState>=PAGER_WRITER_DBMOD || pPager->eState==PAGER_OPEN)
  ){
    rc = sqlite3PagerSync(pPager, 0);
  }
  if( rc==SQLITE_OK ){
    rc = pager_end_transaction(pPager, zSuper[0]!='\0', 0);
    testcase( rc!=SQLITE_OK );
  }
  if( rc==SQLITE_OK && zSuper[0] && res ){
    /* If there was a super-journal and this routine will return success,
    ** see if it is possible to delete the super-journal.
    */
    assert( zSuper==&pPager->pTmpSpace[4] );
    memset(&zSuper[-4], 0, 4);
    rc = pager_delsuper(pPager, zSuper);
    testcase( rc!=SQLITE_OK );
  }
  if( isHot && nPlayback ){
    sqlite3_log(SQLITE_NOTICE_RECOVER_ROLLBACK, "recovered %d pages from %s",
                nPlayback, pPager->zJournal);
  }

  /* The Pager.sectorSize variable may have been updated while rolling
  ** back a journal created by a process with a different sector size
  ** value. Reset it to the correct value for this process.
  */
  setSectorSize(pPager);
  return rc;
}